

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Id<unsigned_int,capnp::_::Segment>,kj::Id<unsigned_int,capnp::_::Segment>>&,char_const(&)[59]>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          DebugComparison<kj::Id<unsigned_int,_capnp::_::Segment>,_kj::Id<unsigned_int,_capnp::_::Segment>_>
          *params,char (*params_1) [59])

{
  undefined4 in_register_00000014;
  char (*params_00) [59];
  long lVar1;
  String argValues [2];
  
  this->exception = (Exception *)0x0;
  str<kj::_::DebugComparison<kj::Id<unsigned_int,capnp::_::Segment>,kj::Id<unsigned_int,capnp::_::Segment>>&>
            (argValues,(kj *)params,
             (DebugComparison<kj::Id<unsigned_int,_capnp::_::Segment>,_kj::Id<unsigned_int,_capnp::_::Segment>_>
              *)CONCAT44(in_register_00000014,line));
  str<char_const(&)[59]>(argValues + 1,(kj *)params_1,params_00);
  init(this,(EVP_PKEY_CTX *)file);
  lVar1 = 0x18;
  do {
    Array<char>::~Array((Array<char> *)((long)&argValues[0].content.ptr + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}